

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_verify
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *msghash32,
              secp256k1_pubkey *pubkey)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  secp256k1_scalar r;
  secp256k1_ge q;
  secp256k1_scalar m;
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_gej pubkeyj;
  secp256k1_strauss_point_state ps [1];
  secp256k1_fe aux [8];
  uchar c [32];
  secp256k1_scalar local_a58;
  secp256k1_ge local_a38;
  secp256k1_scalar local_9e0;
  secp256k1_strauss_state local_9c0;
  secp256k1_scalar local_9a8;
  secp256k1_scalar local_988;
  secp256k1_scalar local_968;
  secp256k1_gej local_948;
  undefined1 local_8c8 [104];
  undefined1 local_860 [16];
  int local_850;
  secp256k1_strauss_point_state local_848;
  secp256k1_fe local_438 [8];
  secp256k1_ge local_2f8 [8];
  
  if (msghash32 == (uchar *)0x0) {
    secp256k1_ecdsa_verify_cold_3();
  }
  else if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_ecdsa_verify_cold_2();
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_ecdsa_verify_cold_1();
  }
  else {
    secp256k1_scalar_set_b32(&local_9e0,msghash32,(int *)0x0);
    local_a58.d[0] = *(uint64_t *)sig->data;
    local_a58.d[1] = *(uint64_t *)(sig->data + 8);
    local_a58.d[2] = *(uint64_t *)(sig->data + 0x10);
    local_a58.d[3] = *(uint64_t *)(sig->data + 0x18);
    uVar1 = *(ulong *)(sig->data + 0x20);
    uVar2 = *(ulong *)(sig->data + 0x28);
    uVar3 = *(ulong *)(sig->data + 0x30);
    local_848.wnaf_na_1._32_8_ = *(undefined8 *)(sig->data + 0x38);
    uVar4 = -(int)((long)local_848.wnaf_na_1._32_8_ >> 0x3f);
    uVar7 = uVar4 ^ 1;
    uVar6 = uVar7;
    if (uVar3 == 0xffffffffffffffff) {
      uVar6 = 0;
    }
    if (0x5d576e7357a4501c < uVar2) {
      uVar7 = 0;
    }
    uVar7 = (uVar7 | uVar6 | (ulong)local_848.wnaf_na_1._32_8_ < 0x7fffffffffffffff) ^ 1;
    uVar6 = 0;
    if (0xdfe92f46681b20a0 < uVar1) {
      uVar6 = uVar7;
    }
    if (0x5d576e7357a4501d < uVar2) {
      uVar6 = uVar7;
    }
    if (uVar6 != 0 || uVar4 != 0) {
      return 0;
    }
    iVar5 = secp256k1_pubkey_load(ctx,&local_a38,pubkey);
    if (iVar5 == 0) {
      return 0;
    }
    auVar9._0_4_ = -(uint)((int)local_a58.d[0] == 0 && (int)local_a58.d[2] == 0);
    auVar9._4_4_ = -(uint)(local_a58.d[0]._4_4_ == 0 && local_a58.d[2]._4_4_ == 0);
    auVar9._8_4_ = -(uint)((int)local_a58.d[1] == 0 && (int)local_a58.d[3] == 0);
    auVar9._12_4_ = -(uint)(local_a58.d[1]._4_4_ == 0 && local_a58.d[3]._4_4_ == 0);
    iVar5 = movmskps(iVar5,auVar9);
    if ((iVar5 != 0xf) &&
       (((uVar2 != 0 || uVar1 != 0) || uVar3 != 0) || local_848.wnaf_na_1._32_8_ != 0)) {
      local_848.wnaf_na_1._0_8_ = uVar1 & 0x3fffffffffffffff;
      local_848.wnaf_na_1._8_8_ = (uVar2 & 0xfffffffffffffff) << 2 | uVar1 >> 0x3e;
      local_848.wnaf_na_1._16_8_ = (uVar3 & 0x3ffffffffffffff) << 4 | uVar2 >> 0x3c;
      local_848.wnaf_na_1._24_8_ =
           (local_848.wnaf_na_1._32_8_ & 0xffffffffffffff) << 6 | uVar3 >> 0x3a;
      local_848.wnaf_na_1._32_8_ = (ulong)local_848.wnaf_na_1._32_8_ >> 0x38;
      secp256k1_modinv64_var
                ((secp256k1_modinv64_signed62 *)&local_848,&secp256k1_const_modinfo_scalar);
      local_968.d[0] = local_848.wnaf_na_1._8_8_ << 0x3e | local_848.wnaf_na_1._0_8_;
      local_968.d[1] = local_848.wnaf_na_1._16_8_ << 0x3c | (ulong)local_848.wnaf_na_1._8_8_ >> 2;
      local_968.d[2] = local_848.wnaf_na_1._24_8_ << 0x3a | (ulong)local_848.wnaf_na_1._16_8_ >> 4;
      local_968.d[3] = local_848.wnaf_na_1._32_8_ << 0x38 | (ulong)local_848.wnaf_na_1._24_8_ >> 6;
      secp256k1_scalar_mul(&local_988,&local_968,&local_9e0);
      secp256k1_scalar_mul(&local_9a8,&local_968,&local_a58);
      local_850 = local_a38.infinity;
      local_8c8._0_8_ = local_a38.x.n[0];
      local_8c8._8_8_ = local_a38.x.n[1];
      local_8c8._16_8_ = local_a38.x.n[2];
      local_8c8._24_8_ = local_a38.x.n[3];
      local_8c8._32_8_ = local_a38.x.n[4];
      local_8c8._40_8_ = local_a38.y.n[0];
      local_8c8._48_8_ = local_a38.y.n[1];
      local_8c8._56_8_ = local_a38.y.n[2];
      local_8c8._64_8_ = local_a38.y.n[3];
      local_8c8._72_8_ = local_a38.y.n[4];
      local_8c8._80_8_ = 1;
      local_8c8._88_16_ = (undefined1  [16])0x0;
      local_860 = (undefined1  [16])0x0;
      local_9c0.aux = local_438;
      local_9c0.pre_a = local_2f8;
      local_9c0.ps = &local_848;
      secp256k1_ecmult_strauss_wnaf
                (&local_9c0,&local_948,1,(secp256k1_gej *)local_8c8,&local_9a8,&local_988);
      if (local_948.infinity == 0) {
        secp256k1_scalar_get_b32((uchar *)local_2f8,&local_a58);
        secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)&local_848,(uchar *)local_2f8);
        iVar5 = secp256k1_gej_eq_x_var((secp256k1_fe *)&local_848,&local_948);
        if (iVar5 != 0) {
          return 1;
        }
        uVar6 = 4;
        do {
          uVar1 = secp256k1_ecdsa_const_p_minus_order.n[uVar6];
          uVar2 = *(ulong *)(local_848.wnaf_na_1 + (ulong)uVar6 * 2);
          if (uVar2 >= uVar1 && uVar2 != uVar1) {
            return 0;
          }
          if (uVar2 < uVar1) {
            local_848.wnaf_na_1._0_8_ = local_848.wnaf_na_1._0_8_ + 0x25e8cd0364141;
            local_848.wnaf_na_1._8_8_ = local_848.wnaf_na_1._8_8_ + 0xe6af48a03bbfd;
            local_848.wnaf_na_1._16_8_ = local_848.wnaf_na_1._16_8_ + 0xffffffebaaedc;
            local_848.wnaf_na_1._24_8_ = local_848.wnaf_na_1._24_8_ + 0xfffffffffffff;
            local_848.wnaf_na_1._32_8_ = local_848.wnaf_na_1._32_8_ + 0xffffffffffff;
            iVar5 = secp256k1_gej_eq_x_var((secp256k1_fe *)&local_848,&local_948);
            return iVar5;
          }
          bVar8 = uVar6 != 0;
          uVar6 = uVar6 - 1;
        } while (bVar8);
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_verify(const secp256k1_context* ctx, const secp256k1_ecdsa_signature *sig, const unsigned char *msghash32, const secp256k1_pubkey *pubkey) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return (!secp256k1_scalar_is_high(&s) &&
            secp256k1_pubkey_load(ctx, &q, pubkey) &&
            secp256k1_ecdsa_sig_verify(&r, &s, &q, &m));
}